

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O0

void * __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_PreWorker>::neighborSetOf
          (STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_PreWorker> *this,
          int idx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> *this_01;
  reference piVar3;
  int local_3c;
  iterator iStack_38;
  int to;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> *__ptr__;
  int idx_local;
  STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_PreWorker> *this_local;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  
  iVar2 = (*(this->super_PreWorker).super_KDefectiveBase._vptr_KDefectiveBase[9])();
  this_00 = (set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(extraout_var,iVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(this_00);
  this_01 = (this->super_PreWorker).super_KDefectiveBase.from + idx;
  __end0 = std::vector<int,_std::allocator<int>_>::begin(this_01);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end0);
    local_3c = *piVar3;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_00,&local_3c);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  return this_00;
}

Assistant:

void* STLSetImplement<Set, Base>::neighborSetOf(int idx) {
	Set *__ptr__ = (Set*) newSet();
	__ptr__ -> clear();
	for (auto to: from[idx]) __ptr__ -> insert(to);
	return __ptr__;
}